

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtree.c
# Opt level: O2

int find_sender(node_info *info,int num_proc,int recv_node,int tile,int display_node,int num_tiles,
               IceTBoolean *all_contained_tmasks)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  node_info *pnVar6;
  
  uVar1 = num_proc;
  uVar4 = 0xffffffff;
  while (num_proc = num_proc - 1, 0 < (int)uVar1) {
    uVar5 = (ulong)(uint)num_proc;
    if (info[uVar5].tile_sending < 0) {
      pnVar6 = info + uVar5;
      iVar3 = pnVar6->rank;
      if ((all_contained_tmasks[iVar3 * num_tiles + tile] == '\0') ||
         (recv_node + 1U == uVar1 || (iVar3 == display_node || pnVar6->tile_receiving == tile)))
      goto LAB_001150ab;
      if (pnVar6->tile_held == tile) goto LAB_001150cc;
      uVar2 = uVar1 - 1;
      uVar1 = num_proc;
      if ((int)uVar4 < 0) {
        uVar4 = uVar2;
      }
    }
    else {
LAB_001150ab:
      uVar1 = uVar1 - 1;
    }
  }
  if ((int)uVar4 < 0) {
    iVar3 = 0;
  }
  else {
    uVar5 = (ulong)uVar4;
    iVar3 = info[uVar5].rank;
LAB_001150cc:
    info[recv_node].tile_held = tile;
    info[recv_node].tile_receiving = tile;
    info[recv_node].recv_src = iVar3;
    info[uVar5].tile_sending = tile;
    info[uVar5].send_dest = info[recv_node].rank;
    if (info[uVar5].tile_held == tile) {
      info[uVar5].tile_held = -1;
    }
    info[uVar5].num_contained = info[uVar5].num_contained + -1;
    all_contained_tmasks[iVar3 * num_tiles + tile] = '\0';
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

static int find_sender(struct node_info *info, int num_proc,
                       int recv_node, int tile,
                       int display_node, int num_tiles,
                       IceTBoolean *all_contained_tmasks)
{
    int send_node;
    int sender = -1;

    for (send_node = num_proc-1; send_node >= 0; send_node--) {
        if (   (info[send_node].tile_sending >= 0)
            || !CONTAINS_TILE(send_node, tile)
            || (info[send_node].tile_receiving == tile)
            || (info[send_node].rank == display_node)
            || (send_node == recv_node) ) {
            continue;
        }
        if (info[send_node].tile_held == tile) {
          /* Favor sending held images. */
            sender = send_node;
            break;
        } else if (sender < 0) {
            sender = send_node;
        }
    }
    
    if (sender >= 0) {
        info[recv_node].tile_held = tile;
        info[recv_node].tile_receiving = tile;
        info[recv_node].recv_src = info[sender].rank;
        info[sender].tile_sending = tile;
        info[sender].send_dest = info[recv_node].rank;
        if (info[sender].tile_held == tile) info[sender].tile_held = -1;
        info[sender].num_contained--;
        all_contained_tmasks[info[sender].rank*num_tiles + tile] = 0;
        return 1;
    } else {
        return 0;
    }
}